

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr toPath_00;
  PathPtr toPath_01;
  String *pSVar1;
  DiskHandle *this_00;
  int fromDirFd;
  size_t sVar2;
  Iface *pIVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  char *pcVar7;
  char *pcVar8;
  String *pSVar9;
  PathPtr PVar10;
  PathPtr path;
  StringPtr toPath_02;
  StringPtr fromPath_01;
  int error;
  NullableValue<int> fromFd;
  PathPtr local_98;
  int local_84;
  DiskHandle *local_80;
  String local_78;
  Function<int_(kj::StringPtr)> local_58;
  String local_48;
  
  local_98.parts.size_ = toPath.parts.size_;
  local_98.parts.ptr = toPath.parts.ptr;
  if ((DiskHandle *)local_98.parts.size_ == (DiskHandle *)0x0) {
    (anonymous_namespace)::DiskHandle::tryTransfer();
    bVar6 = 0;
    goto LAB_0036a8ec;
  }
  if (mode == MOVE) {
    pSVar9 = &local_78;
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(pSVar9,fromDirectory);
    if ((char)local_78.content.ptr != '\x01') {
LAB_0036a86c:
      bVar6 = (byte)pSVar9;
      bVar5 = true;
      goto LAB_0036a8bb;
    }
    fromDirFd = local_78.content.ptr._4_4_;
    local_84 = 0;
    local_80 = this;
    PathPtr::toString(&local_78,&local_98,false);
    sVar2 = local_78.content.size_;
    pcVar8 = local_78.content.ptr;
    PathPtr::toString(&local_48,&fromPath,false);
    toPath_02.content.size_ = sVar2 + (sVar2 == 0);
    if (sVar2 == 0) {
      pcVar8 = "";
    }
    pcVar7 = "";
    if (local_48.content.size_ != 0) {
      pcVar7 = local_48.content.ptr;
    }
    fromPath_01.content.size_ = local_48.content.size_ + (local_48.content.size_ == 0);
    toPath_02.content.ptr = pcVar8;
    fromPath_01.content.ptr = pcVar7;
    bVar5 = tryCommitReplacement(local_80,toPath_02,fromDirFd,fromPath_01,toMode,&local_84);
    sVar2 = local_48.content.size_;
    pcVar8 = local_48.content.ptr;
    pSVar9 = (String *)(ulong)bVar5;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar8,1,sVar2,sVar2);
    }
    sVar2 = local_78.content.size_;
    pcVar8 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar8,1,sVar2,sVar2);
    }
    if (bVar5) {
      bVar6 = 1;
      bVar5 = false;
      goto LAB_0036a8bb;
    }
    if (local_84 == 0) goto LAB_0036a8b8;
    if (local_84 == 0x12) goto LAB_0036a86c;
    if (local_84 == 2) {
      bVar5 = false;
      if ((~toMode & 5) != 0) goto LAB_0036a8b8;
      bVar6 = 0;
      if ((DiskHandle *)local_98.parts.size_ != (DiskHandle *)0x0) {
        PVar10 = PathPtr::parent(&local_98);
        this_00 = local_80;
        bVar5 = tryMkdir(local_80,PVar10,CREATE_PARENT|MODIFY|CREATE,true);
        if (!bVar5) goto LAB_0036a8b8;
        toPath_00.parts.size_ = local_98.parts.size_;
        toPath_00.parts.ptr = local_98.parts.ptr;
        bVar5 = false;
        PVar10.parts.size_ = fromPath.parts.size_;
        PVar10.parts.ptr = fromPath.parts.ptr;
        bVar6 = tryTransfer(this_00,toPath_00,toMode & ~CREATE_PARENT,fromDirectory,PVar10,MOVE,self
                           );
      }
    }
    else {
      _::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                ((Fault *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x5ad,local_84,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,&local_98);
      _::Debug::Fault::~Fault((Fault *)&local_78);
LAB_0036a8b8:
      bVar5 = false;
      bVar6 = 0;
    }
LAB_0036a8bb:
    if (!bVar5) goto LAB_0036a8ec;
  }
  else if (mode == LINK) {
    pSVar9 = &local_48;
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(pSVar9,fromDirectory);
    pSVar1 = local_98.parts.ptr;
    cVar4 = (char)local_48.content.ptr;
    local_78.content.ptr = (char *)CONCAT71(local_78.content.ptr._1_7_,(char)local_48.content.ptr);
    if ((char)local_48.content.ptr == '\x01') {
      local_78.content.ptr = (char *)CONCAT44(local_48.content.ptr._4_4_,local_78.content.ptr._0_4_)
      ;
      local_80 = (DiskHandle *)local_98.parts.size_;
      local_58.impl.ptr = (Iface *)operator_new(0x20);
      (local_58.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0046cb48;
      local_58.impl.ptr[1]._vptr_Iface = (_func_int **)&local_78;
      local_58.impl.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
      local_58.impl.ptr[3]._vptr_Iface = (_func_int **)this;
      local_58.impl.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      path.parts.size_ = (size_t)local_80;
      path.parts.ptr = pSVar1;
      bVar5 = tryReplaceNode(this,path,toMode,&local_58);
      pIVar3 = local_58.impl.ptr;
      pSVar9 = (String *)(ulong)bVar5;
      if (local_58.impl.ptr != (Iface *)0x0) {
        local_58.impl.ptr = (Iface *)0x0;
        (**(local_58.impl.disposer)->_vptr_Disposer)
                  (local_58.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
      }
    }
    bVar6 = (byte)pSVar9;
    if (cVar4 != '\0') goto LAB_0036a8ec;
  }
  toPath_01.parts.size_ = local_98.parts.size_;
  toPath_01.parts.ptr = local_98.parts.ptr;
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  bVar6 = Directory::tryTransfer(self,toPath_01,toMode,fromDirectory,fromPath_00,mode);
LAB_0036a8ec:
  return (bool)(bVar6 & 1);
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(*fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_MAYBE(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), *fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }